

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O3

void __thiscall xLearn::AUCMetricTest_auc_test_Test::TestBody(AUCMetricTest_auc_test_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  ThreadPool *this_00;
  char *pcVar4;
  real_t rVar5;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> pred;
  vector<float,_std::allocator<float>_> Y;
  AUCMetric metric;
  AssertHelper local_c0;
  Message local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<float,_std::allocator<float>_> local_88;
  vector<float,_std::allocator<float>_> local_70;
  AUCMetric local_58;
  
  local_58.super_Metric._vptr_Metric = (_func_int **)0xbf800000bf800000;
  local_58.super_Metric.pool_ = (ThreadPool *)0x3f8000003f800000;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<float,_std::allocator<float>_>::vector(&local_70,__l,(allocator_type *)&local_a8);
  local_58.super_Metric._vptr_Metric = (_func_int **)0x3ecccccd3dcccccd;
  local_58.super_Metric.pool_ = (ThreadPool *)0x3f4ccccd3eb33333;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_58;
  std::vector<float,_std::allocator<float>_>::vector(&local_88,__l_00,(allocator_type *)&local_a8);
  AUCMetric::AUCMetric(&local_58);
  uVar3 = std::thread::hardware_concurrency();
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(ulong)uVar3);
  local_58.super_Metric.threadNumber_ =
       (long)(this_00->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this_00->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_58.super_Metric.pool_ = this_00;
  AUCMetric::Accumulate(&local_58,&local_70,&local_88);
  rVar5 = AUCMetric::GetMetric(&local_58);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&local_a8,"metric_val","0.75",rVar5,0.75);
  if ((char)local_a8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_b8);
    if ((undefined8 *)local_a8._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xac,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (CONCAT71(local_b8.ss_.ptr_._1_7_,local_b8.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_b8.ss_.ptr_._1_7_,local_b8.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_b8.ss_.ptr_._1_7_,local_b8.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AUCMetric::Reset(&local_58);
  local_a8._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_a8._M_string_length = 0x3f8000003f800000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&local_70,&local_a8);
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)0x3ecccccd3dcccccd;
  local_a8._M_string_length = 0x3f4ccccd3eb33333;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&local_88,&local_a8,paVar1);
  AUCMetric::Accumulate(&local_58,&local_70,&local_88);
  rVar5 = AUCMetric::GetMetric(&local_58);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&local_a8,"metric_val","0.75",rVar5,0.75);
  if ((char)local_a8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_b8);
    if ((undefined8 *)local_a8._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_a8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xb2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (CONCAT71(local_b8.ss_.ptr_._1_7_,local_b8.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_b8.ss_.ptr_._1_7_,local_b8.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_b8.ss_.ptr_._1_7_,local_b8.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8.field_2._M_allocated_capacity._0_4_ = 0x435541;
  local_a8._M_string_length = 3;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_b8,"metric.metric_type()","\"AUC\"",&local_a8,(char (*) [4])0x1579e3
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_b8.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xb3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AUCMetric::~AUCMetric(&local_58);
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(AUCMetricTest, auc_test) {
  std::vector<real_t> Y = {-1.0, -1.0, 1.0, 1.0};
  std::vector<real_t> pred = {0.1, 0.4, 0.35, 0.8};
  AUCMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 0.75);
  metric.Reset();
  Y = {-1.0, -1.0, 1.0, 1.0};
  pred = {0.1, 0.4, 0.35, 0.8};
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 0.75);
  EXPECT_EQ(metric.metric_type(), "AUC");
}